

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void AddWindowToDrawData(ImGuiWindow *window,int layer)

{
  bool bVar1;
  ImGuiWindow **ppIVar2;
  undefined4 in_ESI;
  long in_RDI;
  ImGuiWindow *child;
  int i;
  ImGuiViewportP *viewport;
  ImGuiContext *g;
  ImDrawList *in_stack_ffffffffffffffc8;
  ImVector<ImDrawList_*> *in_stack_ffffffffffffffd0;
  int local_24;
  ImGuiContext *pIVar3;
  undefined4 in_stack_fffffffffffffff0;
  
  pIVar3 = GImGui;
  ImVector<ImGuiViewportP_*>::operator[](&GImGui->Viewports,0);
  (pIVar3->IO).MetricsRenderWindows = (pIVar3->IO).MetricsRenderWindows + 1;
  AddDrawListToDrawData(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x170); local_24 = local_24 + 1) {
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[]
                        ((ImVector<ImGuiWindow_*> *)(in_RDI + 0x170),local_24);
    bVar1 = IsWindowActiveAndVisible(*ppIVar2);
    if (bVar1) {
      AddWindowToDrawData((ImGuiWindow *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                          (int)((ulong)pIVar3 >> 0x20));
    }
  }
  return;
}

Assistant:

static void AddWindowToDrawData(ImGuiWindow* window, int layer)
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* viewport = g.Viewports[0];
    g.IO.MetricsRenderWindows++;
    AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[layer], window->DrawList);
    for (int i = 0; i < window->DC.ChildWindows.Size; i++)
    {
        ImGuiWindow* child = window->DC.ChildWindows[i];
        if (IsWindowActiveAndVisible(child)) // Clipped children may have been marked not active
            AddWindowToDrawData(child, layer);
    }
}